

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

bool __thiscall LowererMD::Simd128TryLowerMappedInstruction(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  OpCode *pOVar2;
  code *pcVar3;
  bool bVar4;
  IRType IVar5;
  OpCode OVar6;
  Opnd *pOVar7;
  undefined4 *puVar8;
  ThreadContextInfo *pTVar9;
  intptr_t iVar10;
  MemRefOpnd *pMVar11;
  Opnd *newSrc;
  Opnd *src2;
  Opnd *src1;
  OpCode opcode;
  bool legalize;
  Instr *instr_local;
  LowererMD *this_local;
  
  pOVar2 = this->m_simd128OpCodesMap;
  OVar6 = Js::operator-(instr->m_opcode,Simd128_Start);
  OVar6 = pOVar2[OVar6];
  if (OVar6 == EndOfBlock) {
    return false;
  }
  pOVar7 = IR::Instr::GetDst(instr);
  if (pOVar7 == (Opnd *)0x0) {
LAB_0089fa53:
    pOVar7 = IR::Instr::GetDst(instr);
    IVar5 = IR::Opnd::GetType(pOVar7);
    if (IVar5 != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x38,
                         "(instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32)"
                         ,
                         "instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  else {
    pOVar7 = IR::Instr::GetDst(instr);
    bVar4 = IR::Opnd::IsRegOpnd(pOVar7);
    if (!bVar4) goto LAB_0089fa53;
    pOVar7 = IR::Instr::GetDst(instr);
    bVar4 = IR::Opnd::IsSimd128(pOVar7);
    if (!bVar4) goto LAB_0089fa53;
  }
  pOVar7 = IR::Instr::GetSrc1(instr);
  if (pOVar7 == (Opnd *)0x0) {
LAB_0089fb16:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x39,
                       "(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128())"
                       ,
                       "instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128()"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  else {
    pOVar7 = IR::Instr::GetSrc1(instr);
    bVar4 = IR::Opnd::IsRegOpnd(pOVar7);
    if (!bVar4) goto LAB_0089fb16;
    pOVar7 = IR::Instr::GetSrc1(instr);
    bVar4 = IR::Opnd::IsSimd128(pOVar7);
    if (!bVar4) goto LAB_0089fb16;
  }
  pOVar7 = IR::Instr::GetSrc2(instr);
  if (pOVar7 != (Opnd *)0x0) {
    pOVar7 = IR::Instr::GetSrc2(instr);
    bVar4 = IR::Opnd::IsRegOpnd(pOVar7);
    if (bVar4) {
      pOVar7 = IR::Instr::GetSrc2(instr);
      bVar4 = IR::Opnd::IsSimd128(pOVar7);
      if (bVar4) goto LAB_0089fc63;
    }
    pOVar7 = IR::Instr::GetSrc2(instr);
    bVar4 = IR::Opnd::IsIntConstOpnd(pOVar7);
    if (bVar4) {
      pOVar7 = IR::Instr::GetSrc2(instr);
      IVar5 = IR::Opnd::GetType(pOVar7);
      if (IVar5 == TyInt8) goto LAB_0089fc63;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x3a,
                       "(!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8))))"
                       ,
                       "!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8)))"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
LAB_0089fc63:
  OVar1 = instr->m_opcode;
  if (OVar1 == Simd128_Lt_I4) goto LAB_008a0213;
  if (OVar1 == Simd128_Not_I4) goto LAB_008a0134;
  if (OVar1 == Simd128_Abs_F4) {
    if (OVar6 != ANDPS) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x3f,"(opcode == Js::OpCode::ANDPS)","opcode == Js::OpCode::ANDPS");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pTVar9 = Func::GetThreadContextInfo(this->m_func);
    iVar10 = ThreadContextInfo::GetX86AbsMaskF4Addr(pTVar9);
    pOVar7 = IR::Instr::GetSrc1(instr);
    IVar5 = IR::Opnd::GetType(pOVar7);
    pMVar11 = IR::MemRefOpnd::New(iVar10,IVar5,this->m_func,AddrOpndKindDynamicMisc);
    IR::Instr::SetSrc2(instr,&pMVar11->super_Opnd);
    goto LAB_008a02fc;
  }
  if (OVar1 == Simd128_Neg_F4) {
    if (OVar6 != XORPS) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x47,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pTVar9 = Func::GetThreadContextInfo(this->m_func);
    iVar10 = ThreadContextInfo::GetX86NegMaskF4Addr(pTVar9);
    pOVar7 = IR::Instr::GetSrc1(instr);
    IVar5 = IR::Opnd::GetType(pOVar7);
    pMVar11 = IR::MemRefOpnd::New(iVar10,IVar5,this->m_func,AddrOpndKindDynamicMisc);
    IR::Instr::SetSrc2(instr,&pMVar11->super_Opnd);
    goto LAB_008a02fc;
  }
  if (((ushort)(OVar1 - Simd128_Gt_F4) < 2) || ((ushort)(OVar1 - Simd128_Gt_D2) < 2))
  goto LAB_008a0213;
  if (OVar1 == Simd128_Neg_D2) {
    if (OVar6 != XORPS) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x4b,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pTVar9 = Func::GetThreadContextInfo(this->m_func);
    iVar10 = ThreadContextInfo::GetX86NegMaskD2Addr(pTVar9);
    pOVar7 = IR::Instr::GetSrc1(instr);
    IVar5 = IR::Opnd::GetType(pOVar7);
    pMVar11 = IR::MemRefOpnd::New(iVar10,IVar5,this->m_func,AddrOpndKindDynamicMisc);
    IR::Instr::SetSrc2(instr,&pMVar11->super_Opnd);
    goto LAB_008a02fc;
  }
  if (OVar1 == Simd128_Abs_D2) {
    if (OVar6 != ANDPD) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x43,"(opcode == Js::OpCode::ANDPD)","opcode == Js::OpCode::ANDPD");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pTVar9 = Func::GetThreadContextInfo(this->m_func);
    iVar10 = ThreadContextInfo::GetX86AbsMaskD2Addr(pTVar9);
    pOVar7 = IR::Instr::GetSrc1(instr);
    IVar5 = IR::Opnd::GetType(pOVar7);
    pMVar11 = IR::MemRefOpnd::New(iVar10,IVar5,this->m_func,AddrOpndKindDynamicMisc);
    IR::Instr::SetSrc2(instr,&pMVar11->super_Opnd);
    goto LAB_008a02fc;
  }
  if (OVar1 == Simd128_Lt_I16) {
LAB_008a0213:
    if (((((OVar6 != CMPLTPS) && (OVar6 != CMPLTPD)) &&
         ((OVar6 != CMPLEPS && ((OVar6 != CMPLEPD && (OVar6 != PCMPGTD)))))) && (OVar6 != PCMPGTB))
       && (OVar6 != PCMPGTW)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,100,
                         "(opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB || opcode == Js::OpCode::PCMPGTW)"
                         ,
                         "opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB || opcode == Js::OpCode::PCMPGTW"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pOVar7 = IR::Instr::UnlinkSrc1(instr);
    newSrc = IR::Instr::UnlinkSrc2(instr);
    IR::Instr::SetSrc1(instr,newSrc);
    IR::Instr::SetSrc2(instr,pOVar7);
  }
  else {
    if (((OVar1 != Simd128_Not_I16) && (OVar1 != Simd128_Not_B16)) && (OVar1 != Simd128_Not_I8)) {
      if (OVar1 == Simd128_Lt_I8) goto LAB_008a0213;
      if ((((OVar1 != Simd128_Not_U4) && (OVar1 != Simd128_Not_U8)) && (OVar1 != Simd128_Not_U16))
         && ((OVar1 != Simd128_Not_B4 && (OVar1 != Simd128_Not_B8)))) goto LAB_008a02fc;
    }
LAB_008a0134:
    if (OVar6 != XORPS) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x57,"(opcode == Js::OpCode::XORPS)","opcode == Js::OpCode::XORPS");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pTVar9 = Func::GetThreadContextInfo(this->m_func);
    iVar10 = ThreadContextInfo::GetX86AllNegOnesAddr(pTVar9);
    pOVar7 = IR::Instr::GetSrc1(instr);
    IVar5 = IR::Opnd::GetType(pOVar7);
    pMVar11 = IR::MemRefOpnd::New(iVar10,IVar5,this->m_func,AddrOpndKindDynamicMisc);
    IR::Instr::SetSrc2(instr,&pMVar11->super_Opnd);
  }
LAB_008a02fc:
  instr->m_opcode = OVar6;
  Legalize<false>(instr,false);
  return true;
}

Assistant:

bool LowererMD::Simd128TryLowerMappedInstruction(IR::Instr *instr)
{
    bool legalize = true;
    Js::OpCode opcode = GET_SIMDOPCODE(instr->m_opcode);

    if ((uint32)opcode == 0)
        return false;

    Assert(instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->IsSimd128() || instr->GetDst()->GetType() == TyInt32);
    Assert(instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->IsSimd128());
    Assert(!instr->GetSrc2() || (((instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->IsSimd128()) || (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->GetType() == TyInt8))));

    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_Abs_F4:
        Assert(opcode == Js::OpCode::ANDPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AbsMaskF4Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Abs_D2:
        Assert(opcode == Js::OpCode::ANDPD);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AbsMaskD2Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Neg_F4:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskF4Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Neg_D2:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86NegMaskD2Addr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Not_I4:
    case Js::OpCode::Simd128_Not_I16:
    case Js::OpCode::Simd128_Not_I8:
    case Js::OpCode::Simd128_Not_U4:
    case Js::OpCode::Simd128_Not_U8:
    case Js::OpCode::Simd128_Not_U16:
    case Js::OpCode::Simd128_Not_B4:
    case Js::OpCode::Simd128_Not_B8:
    case Js::OpCode::Simd128_Not_B16:
        Assert(opcode == Js::OpCode::XORPS);
        instr->SetSrc2(IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllNegOnesAddr(), instr->GetSrc1()->GetType(), m_func));
        break;
    case Js::OpCode::Simd128_Gt_F4:
    case Js::OpCode::Simd128_Gt_D2:
    case Js::OpCode::Simd128_GtEq_F4:
    case Js::OpCode::Simd128_GtEq_D2:
    case Js::OpCode::Simd128_Lt_I4:
    case Js::OpCode::Simd128_Lt_I8:
    case Js::OpCode::Simd128_Lt_I16:
    {
        Assert(opcode == Js::OpCode::CMPLTPS || opcode == Js::OpCode::CMPLTPD || opcode == Js::OpCode::CMPLEPS
            || opcode == Js::OpCode::CMPLEPD || opcode == Js::OpCode::PCMPGTD || opcode == Js::OpCode::PCMPGTB
            || opcode == Js::OpCode::PCMPGTW );
        // swap operands
        auto *src1 = instr->UnlinkSrc1();
        auto *src2 = instr->UnlinkSrc2();
        instr->SetSrc1(src2);
        instr->SetSrc2(src1);
        break;
    }

    }
    instr->m_opcode = opcode;
    if (legalize)
    {
        //MakeDstEquSrc1(instr);
        Legalize(instr);
    }

    return true;
}